

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_write_updated_tlm
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  OPJ_UINT32 OVar1;
  long lVar2;
  OPJ_BOOL OVar3;
  OPJ_OFF_T p_size;
  OPJ_SIZE_T OVar4;
  uint uVar5;
  ulong p_size_00;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x2e92,
                  "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager != (opj_event_mgr *)0x0) {
    if (p_stream != (opj_stream_private *)0x0) {
      OVar1 = (p_j2k->m_specific_param).m_decoder.m_start_tile_x;
      lVar2 = (p_j2k->m_specific_param).m_encoder.m_tlm_start;
      p_size = opj_stream_tell(p_stream);
      OVar3 = opj_stream_seek(p_stream,lVar2 + 6,p_manager);
      uVar5 = 0;
      if (OVar3 != 0) {
        p_size_00 = (ulong)(OVar1 * 5);
        OVar4 = opj_stream_write_data
                          (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,p_size_00,
                           p_manager);
        if (OVar4 == p_size_00) {
          OVar3 = opj_stream_seek(p_stream,p_size,p_manager);
          uVar5 = (uint)(OVar3 != 0);
        }
      }
      return uVar5;
    }
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x2e94,
                  "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x2e93,
                "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *p_j2k,
        struct opj_stream_private *p_stream,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 l_tlm_size;
    OPJ_OFF_T l_tlm_position, l_current_position;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    l_tlm_size = 5 * p_j2k->m_specific_param.m_encoder.m_total_tile_parts;
    l_tlm_position = 6 + p_j2k->m_specific_param.m_encoder.m_tlm_start;
    l_current_position = opj_stream_tell(p_stream);

    if (! opj_stream_seek(p_stream, l_tlm_position, p_manager)) {
        return OPJ_FALSE;
    }

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer, l_tlm_size,
                              p_manager) != l_tlm_size) {
        return OPJ_FALSE;
    }

    if (! opj_stream_seek(p_stream, l_current_position, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}